

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

Builder * __thiscall capnp::DynamicValue::Builder::operator=(Builder *this,Builder *other)

{
  if (this->type == CAPABILITY) {
    kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&(this->field_1).textValue);
  }
  Builder(this,other);
  return this;
}

Assistant:

DynamicValue::Builder& DynamicValue::Builder::operator=(Builder& other) {
  if (type == CAPABILITY) {
    kj::dtor(capabilityValue);
  }
  kj::ctor(*this, other);
  return *this;
}